

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyOpsBufferStorageTestCase::initReferenceData(CopyOpsBufferStorageTestCase *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_short *puVar3;
  uint local_18;
  uint local_14;
  uint n_short_value;
  uint n_ref_data_buffer;
  CopyOpsBufferStorageTestCase *this_local;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    auVar1 = ZEXT416(this->m_sparse_bo_size_rounded >> 1) * ZEXT816(2);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    puVar3 = (unsigned_short *)operator_new__(uVar2);
    this->m_ref_data[local_14] = puVar3;
    for (local_18 = 0; local_18 < this->m_sparse_bo_size_rounded >> 1; local_18 = local_18 + 1) {
      this->m_ref_data[local_14][local_18] = ((short)local_14 + 1) * ((short)local_18 + 1);
    }
  }
  return;
}

Assistant:

void CopyOpsBufferStorageTestCase::initReferenceData()
{
	DE_ASSERT(m_sparse_bo_size_rounded != 0);
	DE_ASSERT((m_sparse_bo_size_rounded % 2) == 0);
	DE_ASSERT(sizeof(short) == 2);

	for (unsigned int n_ref_data_buffer = 0; n_ref_data_buffer < sizeof(m_ref_data) / sizeof(m_ref_data[0]);
		 ++n_ref_data_buffer)
	{
		DE_ASSERT(m_ref_data[n_ref_data_buffer] == DE_NULL);

		m_ref_data[n_ref_data_buffer] = new unsigned short[m_sparse_bo_size_rounded / 2];

		/* Write reference values. */
		for (unsigned int n_short_value = 0; n_short_value < m_sparse_bo_size_rounded / 2; ++n_short_value)
		{
			m_ref_data[n_ref_data_buffer][n_short_value] =
				(unsigned short)((n_ref_data_buffer + 1) * (n_short_value + 1));
		}
	} /* for (all reference data buffers) */
}